

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

int makeFileById(int id,string *name,string *str)

{
  bool bVar1;
  int iVar2;
  dir_block *pdVar3;
  char *pcVar4;
  File_Block *pFVar5;
  ulong uVar6;
  int local_150;
  int local_14c;
  int cur;
  int m;
  File_Block *q;
  int k;
  int j;
  char t [252];
  int local_2c;
  bool isfull;
  int i;
  dir_block *p;
  string *str_local;
  string *name_local;
  int id_local;
  
  pdVar3 = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
  bVar1 = true;
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    iVar2 = strcmp(pdVar3->dirs[local_2c].name,"");
    if (iVar2 == 0) {
      bVar1 = false;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)&k,pcVar4);
      strcpy(pdVar3->dirs[local_2c].name,(char *)&k);
      break;
    }
  }
  if (bVar1) {
    name_local._4_4_ = 0;
  }
  else {
    for (q._4_4_ = 0; q._4_4_ < 0x1000; q._4_4_ = q._4_4_ + 1) {
      if ((super_block.inode_bitmap[q._4_4_] & 1U) == 0) {
        pdVar3->dirs[local_2c].inode_id = q._4_4_;
        inodes[q._4_4_].i_mode = 2;
        super_block.inode_bitmap[q._4_4_] = true;
        break;
      }
    }
    for (q._0_4_ = 0; (int)q < 0x1000; q._0_4_ = (int)q + 1) {
      if ((super_block.block_bitmap[(int)q] & 1U) == 0) {
        inodes[q._4_4_].i_blocks[0] = (int)q;
        super_block.block_bitmap[(int)q] = true;
        break;
      }
    }
    pFVar5 = getAddressByLocation_File((int)q);
    local_14c = 0;
    while( true ) {
      uVar6 = std::__cxx11::string::size();
      if (uVar6 <= (ulong)(long)local_14c) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
      pFVar5->data[local_14c] = *pcVar4;
      local_14c = local_14c + 1;
    }
    iVar2 = std::__cxx11::string::size();
    inodes[q._4_4_].i_file_size = iVar2;
    for (local_150 = id; local_150 != 0; local_150 = getParentById(local_150)) {
      iVar2 = std::__cxx11::string::size();
      inodes[local_150].i_file_size = inodes[local_150].i_file_size + iVar2;
    }
    iVar2 = std::__cxx11::string::size();
    inodes[0].i_file_size = inodes[0].i_file_size + iVar2;
    name_local._4_4_ = q._4_4_;
  }
  return name_local._4_4_;
}

Assistant:

int makeFileById(int id, string name, string str) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    bool isfull = true;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") == 0) {//找到空的目录项
            isfull = false;
            char t[252];
            strcpy(t, name.c_str());
            strcpy(p->dirs[i].name, t);//名字
            break;
        }
    }
    if(isfull){
        return 0;
    }
    int j;
    for (j = 0; j < 4096; j++) {
        if (!super_block.inode_bitmap[j]) {
            p->dirs[i].inode_id = j;
            inodes[j].i_mode = A_FILE;
            super_block.inode_bitmap[j] = true;
            break;
        }
    }
    int k;
    for (k = 0; k < 4096; k++) {
        if (!super_block.block_bitmap[k]) {
            inodes[j].i_blocks[0] = k;
            super_block.block_bitmap[k] = true;
            break;
        }
    }
    File_Block *q = getAddressByLocation_File(k);
    for (int m = 0; m < str.size(); m++) {
        q->data[m] = str[m];
    }
    inodes[j].i_file_size = str.size();//文件大小
    int cur = id;
    while (cur)
    {
        inodes[cur].i_file_size += str.size();
        cur = getParentById(cur);
    }
    inodes[0].i_file_size += str.size();
    return j;
}